

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

void set_moreluck(void)

{
  int iVar1;
  obj *poVar2;
  
  iVar1 = stone_luck('\x01');
  if (iVar1 == 0) {
    poVar2 = carrying(0x20f);
    if (poVar2 == (obj *)0x0) {
      u.moreluck = '\0';
      return;
    }
  }
  else if (iVar1 < 0) {
    u.moreluck = -3;
    return;
  }
  u.moreluck = '\x03';
  return;
}

Assistant:

void set_moreluck(void)
{
	int luckbon = stone_luck(TRUE);

	if (!luckbon && !carrying(LUCKSTONE)) u.moreluck = 0;
	else if (luckbon >= 0) u.moreluck = LUCKADD;
	else u.moreluck = -LUCKADD;
}